

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::DoubleFeatureType::DoubleFeatureType
          (DoubleFeatureType *this,DoubleFeatureType *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DoubleFeatureType_00483968;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

constexpr ImageFeatureType_ImageSize::ImageFeatureType_ImageSize(
  ::PROTOBUF_NAMESPACE_ID::internal::ConstantInitialized)
  : width_(uint64_t{0u})
  , height_(uint64_t{0u}){}